

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

void Cba_NtkPrintDistribOld(Cba_Ntk_t *p)

{
  Cba_Man_t *pCVar1;
  int *pUserCounts;
  int pCounts [90];
  int aiStack_188 [90];
  
  memset(aiStack_188,0,0x168);
  pCVar1 = p->pDesign;
  pUserCounts = (int *)calloc((long)(pCVar1->vNtks).nSize,4);
  Cba_ManCreatePrimMap(pCVar1->pTypeNames);
  Cba_NtkCollectDistrib(p,aiStack_188,pUserCounts);
  Cba_NtkPrintDistribStat(p,aiStack_188,pUserCounts);
  if (pUserCounts != (int *)0x0) {
    free(pUserCounts);
    return;
  }
  return;
}

Assistant:

void Cba_NtkPrintDistribOld( Cba_Ntk_t * p )
{
    int pCounts[CBA_BOX_LAST] = {0};
    int * pUserCounts = ABC_CALLOC( int, Cba_ManNtkNum(p->pDesign) + 1 );
    Cba_ManCreatePrimMap( p->pDesign->pTypeNames );
    Cba_NtkCollectDistrib( p, pCounts, pUserCounts );
    Cba_NtkPrintDistribStat( p, pCounts, pUserCounts );
    ABC_FREE( pUserCounts );
}